

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PackedArray.c
# Opt level: O1

PackedArray * PackedArray_create(uint32_t bitsPerItem,uint32_t count)

{
  PackedArray *pPVar1;
  ulong uVar2;
  
  if (bitsPerItem == 0) {
    __assert_fail("bitsPerItem > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ivan2kh[P]sort-big-file-with-a-limited-memory/PackedArray.c"
                  ,0x18a,"PackedArray *PackedArray_create(uint32_t, uint32_t)");
  }
  if (bitsPerItem < 0x21) {
    uVar2 = (ulong)count * (ulong)bitsPerItem + 0x1f >> 5;
    pPVar1 = (PackedArray *)malloc(uVar2 * 4 + 0x10);
    if (pPVar1 != (PackedArray *)0x0) {
      pPVar1->padding[uVar2 + 1] = 0;
      pPVar1->bitsPerItem = bitsPerItem;
      pPVar1->count = count;
    }
    return pPVar1;
  }
  __assert_fail("bitsPerItem <= 32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ivan2kh[P]sort-big-file-with-a-limited-memory/PackedArray.c"
                ,0x18b,"PackedArray *PackedArray_create(uint32_t, uint32_t)");
}

Assistant:

PackedArray* PackedArray_create(uint32_t bitsPerItem, uint32_t count)
{
  PackedArray* a;
  size_t bufferSize;

  PACKEDARRAY_ASSERT(bitsPerItem > 0);
  PACKEDARRAY_ASSERT(bitsPerItem <= 32);

  bufferSize = sizeof(uint32_t) * (((uint64_t)bitsPerItem * (uint64_t)count + 31) / 32);
  a = (PackedArray*)PACKEDARRAY_MALLOC(sizeof(PackedArray) + bufferSize);

  if (a != NULL)
  {
    a->buffer[((uint64_t)bitsPerItem * (uint64_t)count + 31) / 32 - 1] = 0;
    a->bitsPerItem = bitsPerItem;
    a->count = count;
  }

  return a;
}